

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

Frag __thiscall re2::Compiler::Cat(Compiler *this,Frag a,Frag b)

{
  Inst *inst0;
  Frag FVar1;
  uint32_t local_48;
  uint32_t uStack_44;
  uint32_t uStack_40;
  uint uStack_3c;
  uint32_t local_38;
  uint32_t uStack_34;
  uint32_t uStack_30;
  bool bStack_2c;
  uint32_t local_28;
  uint32_t uStack_24;
  uint32_t local_20;
  bool bStack_1c;
  
  local_28 = a.begin;
  uStack_24 = a.end.head;
  local_20 = a.end.tail;
  local_38 = b.begin;
  uStack_34 = b.end.head;
  uStack_30 = b.end.tail;
  if (local_38 == 0 || local_28 == 0) {
    local_48 = 0;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = (uint)uStack_3c._1_3_ << 8;
  }
  else {
    inst0 = (this->inst_).ptr_._M_t.
            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
            super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    if ((((inst0[(int)local_28].out_opcode_ & 7) == 6) && (inst0[(int)local_28].out_opcode_ < 0x10))
       && (uStack_24 == local_28 * 2)) {
      PatchList::Patch(inst0,a.end,local_38);
      uStack_3c = b._12_4_;
      local_48 = local_38;
      uStack_44 = uStack_34;
      uStack_40 = uStack_30;
    }
    else {
      bStack_1c = a.nullable;
      bStack_2c = b.nullable;
      if (this->reversed_ == true) {
        PatchList::Patch(inst0,b.end,local_28);
        local_48 = local_38;
        uStack_44 = uStack_24;
        uStack_40 = local_20;
        uStack_3c = CONCAT31(uStack_3c._1_3_,bStack_2c & bStack_1c) & 0xffffff01;
      }
      else {
        PatchList::Patch(inst0,a.end,local_38);
        local_48 = local_28;
        uStack_44 = uStack_34;
        uStack_40 = uStack_30;
        uStack_3c = CONCAT31(uStack_3c._1_3_,bStack_1c & bStack_2c) & 0xffffff01;
      }
    }
  }
  FVar1.end.head = uStack_44;
  FVar1.begin = local_48;
  FVar1.end.tail = uStack_40;
  FVar1._12_4_ = uStack_3c;
  return FVar1;
}

Assistant:

Frag Compiler::Cat(Frag a, Frag b) {
  if (IsNoMatch(a) || IsNoMatch(b))
    return NoMatch();

  // Elide no-op.
  Prog::Inst* begin = &inst_[a.begin];
  if (begin->opcode() == kInstNop &&
      a.end.head == (a.begin << 1) &&
      begin->out() == 0) {
    // in case refs to a somewhere
    PatchList::Patch(inst_.data(), a.end, b.begin);
    return b;
  }

  // To run backward over string, reverse all concatenations.
  if (reversed_) {
    PatchList::Patch(inst_.data(), b.end, a.begin);
    return Frag(b.begin, a.end, b.nullable && a.nullable);
  }

  PatchList::Patch(inst_.data(), a.end, b.begin);
  return Frag(a.begin, b.end, a.nullable && b.nullable);
}